

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
defyx::AssemblyGeneratorX86::h_CBRANCH(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  undefined1 *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  byte bVar6;
  uint j;
  ostream *poVar7;
  long lVar8;
  
  bVar2 = instr->dst;
  bVar6 = instr->mod >> 4;
  iVar3 = this->registerUsage[bVar2];
  uVar4 = instr->imm32;
  puVar1 = &this->field_0x10;
  poVar7 = std::operator<<((ostream *)puVar1,"\tadd ");
  pcVar5 = *(char **)(regR + (ulong)bVar2 * 8);
  poVar7 = std::operator<<(poVar7,pcVar5);
  poVar7 = std::operator<<(poVar7,", ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,~(0x80 << bVar6) & (0x100 << bVar6 | uVar4));
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)puVar1,"\ttest ");
  poVar7 = std::operator<<(poVar7,pcVar5);
  poVar7 = std::operator<<(poVar7,", ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)puVar1,"\tjz defyx_isn_");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3 + 1);
  std::endl<char,std::char_traits<char>>(poVar7);
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    this->registerUsage[lVar8] = i;
  }
  return;
}

Assistant:

void AssemblyGeneratorX86::h_CBRANCH(Instruction& instr, int i) {
		int reg = instr.dst;
		int target = registerUsage[reg] + 1;
		int shift = instr.getModCond() + ConditionOffset;
		int32_t imm = instr.getImm32() | (1L << shift);
		if (ConditionOffset > 0 || shift > 0)
			imm &= ~(1L << (shift - 1));
		asmCode << "\tadd " << regR[reg] << ", " << imm << std::endl;
		asmCode << "\ttest " << regR[reg] << ", " << (ConditionMask << shift) << std::endl;
		asmCode << "\tjz defyx_isn_" << target << std::endl;
		//mark all registers as used
		for (unsigned j = 0; j < RegistersCount; ++j) {
			registerUsage[j] = i;
		}
	}